

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O1

int ndn_key_storage_add_trusted_certificate(ndn_data_t *certificate)

{
  int iVar1;
  ulong uVar2;
  ndn_ecc_pub_t *ecc_pub;
  byte bVar3;
  int i;
  long lVar4;
  uint32_t key_id;
  
  uVar2 = (ulong)(certificate->name).components_size;
  key_id = 0;
  if (3 < (certificate->name).components[uVar2 - 3].size) {
    lVar4 = 0;
    bVar3 = 0x18;
    key_id = 0;
    do {
      key_id = key_id + ((uint)*(byte *)((long)(certificate->name).components +
                                        lVar4 + uVar2 * 0x2c + -0x80) << (bVar3 & 0x1f));
      lVar4 = lVar4 + 1;
      bVar3 = bVar3 - 8;
    } while (lVar4 != 4);
  }
  ecc_pub = storage.trusted_ecc_pub_keys;
  lVar4 = 10;
  do {
    if (ecc_pub->key_id == 0xffffffff) goto LAB_0010cd1f;
    ecc_pub = ecc_pub + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  ecc_pub = (ndn_ecc_pub_t *)0x0;
LAB_0010cd1f:
  iVar1 = ndn_ecc_pub_init(ecc_pub,certificate->content_value + (certificate->content_size - 0x40),
                           0x40,' ',key_id);
  return iVar1;
}

Assistant:

int
ndn_key_storage_add_trusted_certificate(const ndn_data_t* certificate)
{
  uint32_t keyid = key_id_from_cert_name(&certificate->name);
  // find an empty ECC key
  ndn_ecc_pub_t* pub_key = NULL;
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.trusted_ecc_pub_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      pub_key = &storage.trusted_ecc_pub_keys[i];
      break;
    }
  }
  // load the certificate key into trusted ecc pub keys
  int ret = ndn_ecc_pub_init(pub_key,
                             certificate->content_value + (certificate->content_size - NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE),
                             NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE, NDN_ECDSA_CURVE_SECP256R1, keyid);
  if (ret != NDN_SUCCESS) return ret;
  return NDN_SUCCESS;
}